

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildDescription.cpp
# Opt level: O1

Node * __thiscall
llbuild::buildsystem::BuildDescription::addNode
          (BuildDescription *this,
          unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>
          *value)

{
  Node *pNVar1;
  long lVar2;
  Node *pNVar3;
  long *plVar4;
  StringRef Key;
  pair<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_bool>
  pVar5;
  
  pNVar1 = (value->_M_t).
           super___uniq_ptr_impl<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::buildsystem::Node_*,_std::default_delete<llbuild::buildsystem::Node>_>
           .super__Head_base<0UL,_llbuild::buildsystem::Node_*,_false>._M_head_impl;
  Key.Data = (pNVar1->name)._M_dataplus._M_p;
  Key.Length = (pNVar1->name)._M_string_length;
  pVar5 = llvm::
          StringMap<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>,_llvm::MallocAllocator>
          ::try_emplace<>(&this->nodes,Key);
  lVar2 = *(long *)pVar5.first.
                   super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
                   .Ptr.
                   super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
  ;
  pNVar3 = (value->_M_t).
           super___uniq_ptr_impl<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::buildsystem::Node_*,_std::default_delete<llbuild::buildsystem::Node>_>
           .super__Head_base<0UL,_llbuild::buildsystem::Node_*,_false>._M_head_impl;
  (value->_M_t).
  super___uniq_ptr_impl<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>
  ._M_t.
  super__Tuple_impl<0UL,_llbuild::buildsystem::Node_*,_std::default_delete<llbuild::buildsystem::Node>_>
  .super__Head_base<0UL,_llbuild::buildsystem::Node_*,_false>._M_head_impl = (Node *)0x0;
  plVar4 = *(long **)(lVar2 + 8);
  *(Node **)(lVar2 + 8) = pNVar3;
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 8))();
  }
  return pNVar1;
}

Assistant:

Node& BuildDescription::addNode(std::unique_ptr<Node> value) {
  auto& result = *value.get();
  getNodes()[value->getName()] = std::move(value);
  return result;
}